

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O3

hrgls_Status hrgls_APIDataBlobSourceGetName(hrgls_APIDataBlobSourceInfo info,char **returnName)

{
  if (info == (hrgls_APIDataBlobSourceInfo)0x0) {
    return 0x3ee;
  }
  if (returnName != (char **)0x0) {
    *returnName = (info->name)._M_dataplus._M_p;
    return 0;
  }
  return 0x3e9;
}

Assistant:

hrgls_Status hrgls_APIDataBlobSourceGetName(
    hrgls_APIDataBlobSourceInfo info, const char **returnName)
  {
    hrgls_Status s = hrgls_STATUS_OKAY;
    if (!info) {
      return hrgls_STATUS_NULL_OBJECT_POINTER;
    }
    if (!returnName) {
      return hrgls_STATUS_BAD_PARAMETER;
    }

    *returnName = info->name.c_str();
    return s;
  }